

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O1

void __thiscall
QNetworkRequestFactory::setAttribute
          (QNetworkRequestFactory *this,Attribute attribute,QVariant *value)

{
  QNetworkRequestFactoryPrivate *pQVar1;
  long in_FS_OFFSET;
  Attribute copy;
  Attribute local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((attribute < RedirectPolicyAttribute) &&
     ((0x30024fU >> (attribute & (UseCredentialsAttribute|ConnectionEncryptedAttribute)) & 1) != 0))
  {
    lcQrequestfactory();
    if (((byte)lcQrequestfactory::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        != 0) {
      setAttribute((QNetworkRequestFactory *)(ulong)attribute);
    }
  }
  else {
    pQVar1 = (this->d).d.ptr;
    if ((pQVar1 != (QNetworkRequestFactoryPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach_helper(&this->d);
    }
    local_24 = attribute;
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::Attribute,QVariant> *)&((this->d).d.ptr)->attributes,
               &local_24,value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkRequestFactory::setAttribute(QNetworkRequest::Attribute attribute,
                                          const QVariant &value)
{
    if (attribute == QNetworkRequest::HttpStatusCodeAttribute
        || attribute == QNetworkRequest::HttpReasonPhraseAttribute
        || attribute == QNetworkRequest::RedirectionTargetAttribute
        || attribute == QNetworkRequest::ConnectionEncryptedAttribute
        || attribute == QNetworkRequest::SourceIsFromCacheAttribute
        || attribute == QNetworkRequest::HttpPipeliningWasUsedAttribute
        || attribute == QNetworkRequest::Http2WasUsedAttribute
        || attribute == QNetworkRequest::OriginalContentLengthAttribute)
    {
        qCWarning(lcQrequestfactory, "%i is a reply-only attribute, ignoring.", attribute);
        return;
    }
    d.detach();
    d->attributes.insert(attribute, value);
}